

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Func.h
# Opt level: O0

bool __thiscall Func::HasArrayInfo(Func *this)

{
  bool bVar1;
  BOOL BVar2;
  uint sourceContextId;
  uint functionId;
  Func *this_00;
  intptr_t iVar3;
  byte local_19;
  Func *top;
  Func *this_local;
  
  this_00 = GetTopFunc(this);
  bVar1 = HasProfileInfo(this);
  local_19 = 0;
  if (bVar1) {
    iVar3 = GetWeakFuncRef(this);
    local_19 = 0;
    if (iVar3 != 0) {
      BVar2 = HasTry(this_00);
      if (BVar2 != 0) {
        bVar1 = DoOptimizeTry(this_00);
        local_19 = 0;
        if (!bVar1) goto LAB_00667411;
      }
      bVar1 = DoGlobOpt(this_00);
      local_19 = 0;
      if (bVar1) {
        sourceContextId = GetSourceContextId(this_00);
        functionId = GetLocalFunctionId(this_00);
        bVar1 = Js::Phases::IsEnabled
                          ((Phases *)&DAT_01eafdf0,LoopFastPathPhase,sourceContextId,functionId);
        local_19 = bVar1 ^ 0xff;
      }
    }
  }
LAB_00667411:
  return (bool)(local_19 & 1);
}

Assistant:

bool                HasArrayInfo()
    {
        const auto top = this->GetTopFunc();
        return this->HasProfileInfo() && this->GetWeakFuncRef() && !(top->HasTry() && !top->DoOptimizeTry()) &&
            top->DoGlobOpt() && !PHASE_OFF(Js::LoopFastPathPhase, top);
    }